

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O1

void __thiscall
IndividualBeliefJESP::IndividualBeliefJESP
          (IndividualBeliefJESP *this,void **vtt,Index agentI,Index stage,
          PlanningUnitMADPDiscrete *pu)

{
  SDV *this_00;
  void *pvVar1;
  iterator __position;
  iterator iVar2;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_01;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_t *psVar5;
  size_t nrJOH_others;
  size_t nrS;
  size_t nrOH_j;
  allocator_type local_79;
  undefined8 local_78;
  unsigned_long local_70;
  unsigned_long local_68;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_60;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_58;
  vector<double,_std::allocator<double>_> local_50;
  void **local_38;
  
  local_38 = vtt + 1;
  Belief::Belief(&this->super_Belief,local_38,0);
  pvVar1 = *vtt;
  *(void **)&this->super_Belief = pvVar1;
  *(void **)(&(this->super_Belief).field_0x0 + *(long *)((long)pvVar1 + -0xb8)) = vtt[3];
  this->_m_pumadp = pu;
  this->_m_stage = stage;
  this->_m_agentI = agentI;
  local_58 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_m_others;
  local_60 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_m_sizeVec;
  (this->_m_others).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_others).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_others).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = PlanningUnitMADPDiscrete::GetNrStates(pu);
  iVar3 = (*(this->_m_pumadp->super_PlanningUnit)._vptr_PlanningUnit[6])();
  this->_m_nrAgents = CONCAT44(extraout_var,iVar3);
  local_70 = 1;
  local_78 = (value_type_conflict3)((ulong)local_78._4_4_ << 0x20);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    uVar4 = 0;
    do {
      if ((uint)uVar4 != agentI) {
        __position._M_current =
             (this->_m_others).super_SDT.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_m_others).super_SDT.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_58,__position,(uint *)&local_78);
        }
        else {
          *__position._M_current = (uint)uVar4;
          (this->_m_others).super_SDT.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)PlanningUnitMADPDiscrete::GetNrObservationHistories
                                       (this->_m_pumadp,(Index)local_78,stage);
        local_70 = local_70 *
                   (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
        iVar2._M_current =
             (this->_m_nrOH_others).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_m_nrOH_others,
                     iVar2,(unsigned_long *)&local_50);
        }
        else {
          *iVar2._M_current =
               (unsigned_long)
               local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      uVar4 = (ulong)((Index)local_78 + 1);
      local_78 = (value_type_conflict3)CONCAT44(local_78._4_4_,(Index)local_78 + 1);
    } while (uVar4 < this->_m_nrAgents);
  }
  local_78 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,local_70 * local_68,(value_type_conflict3 *)&local_78,&local_79);
  this_00 = &(this->super_Belief)._m_b.super_SDV;
  if (this_00 != &local_50) {
    std::vector<double,_std::allocator<double>_>::operator=(this_00,&local_50);
  }
  this_01 = local_60;
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar2._M_current =
       (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>(this_01,iVar2,&local_68);
  }
  else {
    *iVar2._M_current = local_68;
    (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>(this_01,iVar2,&local_70);
  }
  else {
    *iVar2._M_current = local_70;
    (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  psVar5 = IndexTools::CalculateStepSize
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  this->_m_stepsizeSJOH = psVar5;
  psVar5 = IndexTools::CalculateStepSize(&this->_m_nrOH_others);
  this->_m_stepsizeJOHOH = psVar5;
  return;
}

Assistant:

IndividualBeliefJESP::IndividualBeliefJESP(Index agentI, Index stage,
    const PlanningUnitMADPDiscrete& pu) 
    :
    Belief(0),
    _m_pumadp(&pu),
    _m_stage(stage),
    _m_agentI(agentI)
{
    //compute size of  this belief:
    size_t nrS = _m_pumadp->GetNrStates();
    _m_nrAgents= _m_pumadp->GetNrAgents();
    size_t nrJOH_others = 1;
    for(Index j=0; j < _m_nrAgents; j++)
    {
        if(j == agentI)
            continue;
        //else:
        _m_others.push_back(j);
        size_t nrOH_j = _m_pumadp->GetNrObservationHistories(j, stage);
        nrJOH_others *=  nrOH_j;
        _m_nrOH_others.push_back(nrOH_j);
    }
    size_t size = nrS * nrJOH_others;
    _m_b = vector<double>(size,0.0);
    _m_sizeVec.push_back(nrS);
    _m_sizeVec.push_back(nrJOH_others);
    _m_stepsizeSJOH = IndexTools::CalculateStepSize(_m_sizeVec);

    //we will use 
    // IndexTools::JointToIndividualIndicesStepSize(Index jointI, 
    //      const vector<size_t> &step_size, size_t vec_size )
    //and
    // IndexTools::IndividualToJointIndicesStepSize (const std::vector< Index >
    //      &indices, const std::vector< size_t > &step_size)
    //
    // to do the conversions between JOHI_j <-> <OHI_1,...,OHI_nrA >
    //
    // so we cah the step_size
    _m_stepsizeJOHOH = IndexTools::CalculateStepSize(_m_nrOH_others);
}